

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::ParseURL
               (string *URL,string *protocol,string *username,string *password,string *hostname,
               string *dataport,string *database)

{
  bool bVar1;
  RegularExpression urlRe;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  string *local_110;
  string *local_108;
  RegularExpression local_100;
  
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  local_108 = hostname;
  RegularExpression::compile
            (&local_100,"([a-zA-Z0-9]*)://(([A-Za-z0-9]+)(:([^:@]+))?@)?([^:@/]+)(:([0-9]+))?/(.+)?"
            );
  bVar1 = RegularExpression::find(&local_100,(URL->_M_dataplus)._M_p,&local_100.regmatch);
  if (bVar1) {
    local_130 = &local_120;
    local_110 = dataport;
    if (local_100.regmatch.startp[1] == (char *)0x0) {
      local_128 = 0;
      local_120 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,local_100.regmatch.startp[1],local_100.regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (local_100.regmatch.startp[3] == (char *)0x0) {
      local_128 = 0;
      local_120 = 0;
      local_130 = &local_120;
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,local_100.regmatch.startp[3],local_100.regmatch.endp[3]);
    }
    std::__cxx11::string::operator=((string *)username,(string *)&local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (local_100.regmatch.startp[5] == (char *)0x0) {
      local_128 = 0;
      local_120 = 0;
      local_130 = &local_120;
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,local_100.regmatch.startp[5],local_100.regmatch.endp[5]);
    }
    std::__cxx11::string::operator=((string *)password,(string *)&local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (local_100.regmatch.startp[6] == (char *)0x0) {
      local_128 = 0;
      local_120 = 0;
      local_130 = &local_120;
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,local_100.regmatch.startp[6],local_100.regmatch.endp[6]);
    }
    std::__cxx11::string::operator=((string *)local_108,(string *)&local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (local_100.regmatch.startp[8] == (char *)0x0) {
      local_128 = 0;
      local_120 = 0;
      local_130 = &local_120;
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,local_100.regmatch.startp[8],local_100.regmatch.endp[8]);
    }
    std::__cxx11::string::operator=((string *)local_110,(string *)&local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (local_100.regmatch.startp[9] == (char *)0x0) {
      local_128 = 0;
      local_120 = 0;
      local_130 = &local_120;
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,local_100.regmatch.startp[9],local_100.regmatch.endp[9]);
    }
    std::__cxx11::string::operator=((string *)database,(string *)&local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return bVar1;
}

Assistant:

bool SystemTools::ParseURL(const std::string& URL, std::string& protocol,
                           std::string& username, std::string& password,
                           std::string& hostname, std::string& dataport,
                           std::string& database)
{
  kwsys::RegularExpression urlRe(VTK_URL_REGEX);
  if (!urlRe.find(URL))
    return false;

  // match 0 URL
  // match 1 protocol
  // match 2 mangled user
  // match 3 username
  // match 4 mangled password
  // match 5 password
  // match 6 hostname
  // match 7 mangled port
  // match 8 dataport
  // match 9 database name

  protocol = urlRe.match(1);
  username = urlRe.match(3);
  password = urlRe.match(5);
  hostname = urlRe.match(6);
  dataport = urlRe.match(8);
  database = urlRe.match(9);

  return true;
}